

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

MTBDD mtbdd_cube(MTBDD variables,uint8_t *cube,MTBDD terminal)

{
  uint32_t uVar1;
  mtbddnode_t node;
  MTBDD MVar2;
  mtbddnode_t n_00;
  MTBDD mtbdd;
  BDD high;
  BDD low;
  uint32_t var2;
  mtbddnode_t n2;
  MTBDD variables2;
  BDD result;
  mtbddnode_t n;
  MTBDD terminal_local;
  uint8_t *cube_local;
  MTBDD variables_local;
  
  variables_local = terminal;
  if (variables != 0x8000000000000000) {
    node = MTBDD_GETNODE(variables);
    switch(*cube) {
    case '\0':
      MVar2 = mtbddnode_followhigh(variables,node);
      MVar2 = mtbdd_cube(MVar2,cube + 1,terminal);
      uVar1 = mtbddnode_getvariable(node);
      variables_local = mtbdd_makenode(uVar1,MVar2,0);
      break;
    case '\x01':
      MVar2 = mtbddnode_followhigh(variables,node);
      MVar2 = mtbdd_cube(MVar2,cube + 1,terminal);
      uVar1 = mtbddnode_getvariable(node);
      variables_local = mtbdd_makenode(uVar1,0,MVar2);
      break;
    case '\x02':
      MVar2 = mtbddnode_followhigh(variables,node);
      variables_local = mtbdd_cube(MVar2,cube + 1,terminal);
      break;
    case '\x03':
      MVar2 = mtbddnode_followhigh(variables,node);
      n_00 = MTBDD_GETNODE(MVar2);
      uVar1 = mtbddnode_getvariable(n_00);
      MVar2 = mtbddnode_followhigh(MVar2,n_00);
      MVar2 = mtbdd_cube(MVar2,cube + 2,terminal);
      mtbdd = mtbdd_makenode(uVar1,MVar2,0);
      mtbdd_refs_push(mtbdd);
      MVar2 = mtbdd_makenode(uVar1,0,MVar2);
      mtbdd_refs_pop(1);
      uVar1 = mtbddnode_getvariable(node);
      variables_local = mtbdd_makenode(uVar1,mtbdd,MVar2);
      break;
    default:
      variables_local = 0;
    }
  }
  return variables_local;
}

Assistant:

MTBDD
mtbdd_cube(MTBDD variables, uint8_t *cube, MTBDD terminal)
{
    if (variables == mtbdd_true) return terminal;
    mtbddnode_t n = MTBDD_GETNODE(variables);

    BDD result;
    switch (*cube) {
    case 0:
        result = mtbdd_cube(node_gethigh(variables, n), cube+1, terminal);
        result = mtbdd_makenode(mtbddnode_getvariable(n), result, mtbdd_false);
        return result;
    case 1:
        result = mtbdd_cube(node_gethigh(variables, n), cube+1, terminal);
        result = mtbdd_makenode(mtbddnode_getvariable(n), mtbdd_false, result);
        return result;
    case 2:
        return mtbdd_cube(node_gethigh(variables, n), cube+1, terminal);
    case 3:
    {
        MTBDD variables2 = node_gethigh(variables, n);
        mtbddnode_t n2 = MTBDD_GETNODE(variables2);
        uint32_t var2 = mtbddnode_getvariable(n2);
        result = mtbdd_cube(node_gethigh(variables2, n2), cube+2, terminal);
        BDD low = mtbdd_makenode(var2, result, mtbdd_false);
        mtbdd_refs_push(low);
        BDD high = mtbdd_makenode(var2, mtbdd_false, result);
        mtbdd_refs_pop(1);
        result = mtbdd_makenode(mtbddnode_getvariable(n), low, high);
        return result;
    }
    default:
        return mtbdd_false; // ?
    }
}